

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  string local_68;
  TimeInMillis local_48;
  String local_40;
  String local_30;
  
  bVar1 = UnitTest::Passed(unit_test);
  local_48 = unit_test->impl_->elapsed_time_;
  StreamableToString<long_long>((internal *)&local_40,&local_48);
  String::Format(&local_30,"event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,
                 local_40.c_str_);
  String::operator_cast_to_string(&local_68,&local_30);
  Send(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  String::~String(&local_30);
  String::~String(&local_40);
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    Send(String::Format("event=TestIterationEnd&passed=%d&elapsed_time=%sms\n",
                        unit_test.Passed(),
                        StreamableToString(unit_test.elapsed_time()).c_str()));
  }